

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O0

DdNode * BuildSubsetBdd(DdManager *dd,st__table *pathTable,DdNode *node,AssortedInfo *info,
                       st__table *subsetNodeTable)

{
  bool bVar1;
  int iVar2;
  uint i;
  ulong uVar3;
  int local_100;
  uint local_fc;
  DdHalfWord local_f8;
  uint local_f4;
  int elseDone;
  int thenDone;
  int processingDone;
  int tiebreakChild;
  uint NnvBotDist;
  uint NvBotDist;
  uint NvPathLength;
  uint NnvPathLength;
  uint evenLen;
  uint oddLen;
  uint childPathLength;
  uint topid;
  char *entry;
  DdNode *regNew;
  DdNode *topv;
  DdNode *neW;
  NodeDist_t *nodeStatNnv;
  NodeDist_t *nodeStat;
  NodeDist_t *nodeStatNv;
  DdNode *regNv;
  DdNode *regNnv;
  DdNode *regChild;
  DdNode *child;
  DdNode *childBranch;
  DdNode *ElseBranch;
  DdNode *ThenBranch;
  DdNode *Nnv;
  DdNode *Nv;
  DdNode *N;
  st__table *subsetNodeTable_local;
  AssortedInfo *info_local;
  DdNode *node_local;
  st__table *pathTable_local;
  DdManager *dd_local;
  
  regNv = (DdNode *)0x0;
  nodeStatNv = (NodeDist_t *)0x0;
  NvBotDist = 0;
  NnvBotDist = 0;
  dd_local = (DdManager *)node;
  if (*(int *)((ulong)node & 0xfffffffffffffffe) != 0x7fffffff) {
    Nv = (DdNode *)((ulong)node & 0xfffffffffffffffe);
    N = (DdNode *)subsetNodeTable;
    subsetNodeTable_local = (st__table *)info;
    info_local = (AssortedInfo *)node;
    node_local = (DdNode *)pathTable;
    pathTable_local = (st__table *)dd;
    iVar2 = st__lookup(pathTable,(char *)Nv,(char **)&nodeStatNnv);
    if (iVar2 == 0) {
      fprintf((FILE *)pathTable_local[0xc].bins,"Something wrong, node must be in table \n");
      *(undefined4 *)&pathTable_local[0xd].compare = 5;
      dd_local = (DdManager *)0x0;
    }
    else {
      if (((ulong)info_local & 1) == 0) {
        if (nodeStatNnv->regResult != (DdNode *)0x0) {
          return nodeStatNnv->regResult;
        }
      }
      else if (nodeStatNnv->compResult != (DdNode *)0x0) {
        return nodeStatNnv->compResult;
      }
      Nnv = (DdNode *)
            (*(ulong *)(((ulong)Nv & 0xfffffffffffffffe) + 0x10) ^ (long)(int)((uint)info_local & 1)
            );
      ThenBranch = (DdNode *)
                   (*(ulong *)(((ulong)Nv & 0xfffffffffffffffe) + 0x18) ^
                   (long)(int)((uint)info_local & 1));
      elseDone = 0;
      bVar1 = false;
      ElseBranch = (DdNode *)0x0;
      childBranch = (DdNode *)0x0;
      if (*(int *)((ulong)Nnv & 0xfffffffffffffffe) == 0x7fffffff) {
        if ((Nnv == (DdNode *)pathTable_local->bins) &&
           (*(int *)((long)&subsetNodeTable_local->compare + 4) != 0)) {
          *(undefined4 *)((long)&subsetNodeTable_local->compare + 4) = 0;
        }
        *(int *)(((ulong)Nnv & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)Nnv & 0xfffffffffffffffe) + 4) + 1;
        if (Nnv == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
        bVar1 = true;
        elseDone = 1;
        tiebreakChild = -1;
        ElseBranch = Nnv;
      }
      else {
        nodeStatNv = (NodeDist_t *)((ulong)Nnv & 0xfffffffffffffffe);
        iVar2 = st__lookup((st__table *)node_local,(char *)nodeStatNv,(char **)&nodeStat);
        if (iVar2 == 0) {
          fprintf((FILE *)pathTable_local[0xc].bins,"Something wrong, node must be in table\n");
          *(undefined4 *)&pathTable_local[0xd].compare = 5;
          return (DdNode *)0x0;
        }
        if ((nodeStat->oddTopDist == 0xffffffff) || (nodeStat->oddBotDist == 0xffffffff)) {
          NnvPathLength = 0xffffffff;
        }
        else {
          NnvPathLength = nodeStat->oddTopDist + nodeStat->oddBotDist;
        }
        if ((nodeStat->evenTopDist == 0xffffffff) || (nodeStat->evenBotDist == 0xffffffff)) {
          NvPathLength = 0xffffffff;
        }
        else {
          NvPathLength = nodeStat->evenTopDist + nodeStat->evenBotDist;
        }
        if (NvPathLength < NnvPathLength) {
          local_f4 = NvPathLength;
        }
        else {
          local_f4 = NnvPathLength;
        }
        NnvBotDist = local_f4;
        if (NvPathLength < NnvPathLength) {
          local_f8 = nodeStat->evenBotDist;
        }
        else {
          local_f8 = nodeStat->oddBotDist;
        }
        tiebreakChild = local_f8;
      }
      if (*(int *)((ulong)ThenBranch & 0xfffffffffffffffe) == 0x7fffffff) {
        if ((ThenBranch == (DdNode *)pathTable_local->bins) &&
           (*(int *)((long)&subsetNodeTable_local->compare + 4) != 0)) {
          *(undefined4 *)((long)&subsetNodeTable_local->compare + 4) = 0;
        }
        childBranch = ThenBranch;
        *(int *)(((ulong)ThenBranch & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)ThenBranch & 0xfffffffffffffffe) + 4) + 1;
        if (ThenBranch == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
        elseDone = elseDone + 1;
        processingDone = -1;
      }
      else {
        regNv = (DdNode *)((ulong)ThenBranch & 0xfffffffffffffffe);
        iVar2 = st__lookup((st__table *)node_local,(char *)regNv,(char **)&neW);
        if (iVar2 == 0) {
          fprintf((FILE *)pathTable_local[0xc].bins,"Something wrong, node must be in table\n");
          *(undefined4 *)&pathTable_local[0xd].compare = 5;
          return (DdNode *)0x0;
        }
        if ((neW->index == 0xffffffff) || (*(int *)&neW->next == -1)) {
          NnvPathLength = 0xffffffff;
        }
        else {
          NnvPathLength = neW->index + *(int *)&neW->next;
        }
        if ((neW->ref == 0xffffffff) || (*(int *)((long)&neW->next + 4) == -1)) {
          NvPathLength = 0xffffffff;
        }
        else {
          NvPathLength = neW->ref + *(int *)((long)&neW->next + 4);
        }
        if (NvPathLength < NnvPathLength) {
          local_fc = NvPathLength;
        }
        else {
          local_fc = NnvPathLength;
        }
        NvBotDist = local_fc;
        if (NvPathLength < NnvPathLength) {
          local_100 = *(int *)((long)&neW->next + 4);
        }
        else {
          local_100 = *(int *)&neW->next;
        }
        processingDone = local_100;
      }
      for (; elseDone != 2; elseDone = elseDone + 1) {
        if (elseDone == 0) {
          if ((NnvBotDist < NvBotDist) ||
             ((NnvBotDist == NvBotDist && ((uint)tiebreakChild <= (uint)processingDone)))) {
            regChild = Nnv;
            regNnv = (DdNode *)nodeStatNv;
            bVar1 = true;
            evenLen = NnvBotDist;
          }
          else {
            regChild = ThenBranch;
            regNnv = regNv;
            evenLen = NvBotDist;
          }
        }
        else if (bVar1) {
          regChild = ThenBranch;
          regNnv = regNv;
          evenLen = NvBotDist;
        }
        else {
          regChild = Nnv;
          regNnv = (DdNode *)nodeStatNv;
          bVar1 = true;
          evenLen = NnvBotDist;
        }
        if (*(uint *)&subsetNodeTable_local->compare < evenLen) {
          child = zero;
        }
        else if (evenLen < *(uint *)&subsetNodeTable_local->compare) {
          if (*(int *)((long)&subsetNodeTable_local->compare + 4) != 0) {
            *(undefined4 *)((long)&subsetNodeTable_local->compare + 4) = 0;
          }
          child = BuildSubsetBdd((DdManager *)pathTable_local,(st__table *)node_local,regChild,
                                 (AssortedInfo *)subsetNodeTable_local,(st__table *)N);
        }
        else {
          iVar2 = st__lookup(*(st__table **)&subsetNodeTable_local->num_bins,(char *)regNnv,
                             (char **)&childPathLength);
          if (iVar2 == 0) {
            if (*(int *)&subsetNodeTable_local->hash < 1) {
              if (*(int *)((long)&subsetNodeTable_local->compare + 4) == 0) {
                child = zero;
              }
              else {
                iVar2 = st__insert(*(st__table **)&subsetNodeTable_local->num_bins,(char *)regNnv,
                                   (char *)0x0);
                if (iVar2 == -10000) {
                  memOut = 1;
                  fprintf((FILE *)pathTable_local[0xc].bins,"OUT of memory\n");
                  *(undefined4 *)&subsetNodeTable_local->hash = 0;
                  child = zero;
                }
                else {
                  *(int *)&subsetNodeTable_local->hash = *(int *)&subsetNodeTable_local->hash + -1;
                  child = BuildSubsetBdd((DdManager *)pathTable_local,(st__table *)node_local,
                                         regChild,(AssortedInfo *)subsetNodeTable_local,
                                         (st__table *)N);
                }
              }
            }
            else {
              iVar2 = st__insert(*(st__table **)&subsetNodeTable_local->num_bins,(char *)regNnv,
                                 (char *)0x0);
              if (iVar2 == -10000) {
                memOut = 1;
                fprintf((FILE *)pathTable_local[0xc].bins,"OUT of memory\n");
                *(undefined4 *)&subsetNodeTable_local->hash = 0;
                child = zero;
              }
              else {
                *(int *)&subsetNodeTable_local->hash = *(int *)&subsetNodeTable_local->hash + -1;
                if (*(int *)&subsetNodeTable_local->hash < 1) {
                  *(undefined4 *)((long)&subsetNodeTable_local->compare + 4) = 1;
                }
                child = BuildSubsetBdd((DdManager *)pathTable_local,(st__table *)node_local,regChild
                                       ,(AssortedInfo *)subsetNodeTable_local,(st__table *)N);
              }
            }
          }
          else {
            if (*(int *)((long)&subsetNodeTable_local->compare + 4) != 0) {
              *(undefined4 *)((long)&subsetNodeTable_local->compare + 4) = 0;
            }
            child = BuildSubsetBdd((DdManager *)pathTable_local,(st__table *)node_local,regChild,
                                   (AssortedInfo *)subsetNodeTable_local,(st__table *)N);
          }
        }
        if (child == (DdNode *)0x0) {
          if (ElseBranch != (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)pathTable_local,ElseBranch);
            ElseBranch = (DdNode *)0x0;
          }
          if (childBranch != (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)pathTable_local,childBranch);
          }
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)child & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)child & 0xfffffffffffffffe) + 4) + 1;
        if (regChild == Nnv) {
          ElseBranch = child;
        }
        else {
          childBranch = child;
        }
      }
      *(undefined4 *)((long)&subsetNodeTable_local->compare + 4) = 0;
      i = Cudd_NodeReadIndex(Nv);
      regNew = Cudd_ReadVars((DdManager *)pathTable_local,i);
      *(int *)(((ulong)regNew & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)regNew & 0xfffffffffffffffe) + 4) + 1;
      topv = cuddBddIteRecur((DdManager *)pathTable_local,regNew,ElseBranch,childBranch);
      if (topv != (DdNode *)0x0) {
        *(int *)(((ulong)topv & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)topv & 0xfffffffffffffffe) + 4) + 1;
      }
      Cudd_RecursiveDeref((DdManager *)pathTable_local,regNew);
      Cudd_RecursiveDeref((DdManager *)pathTable_local,ElseBranch);
      Cudd_RecursiveDeref((DdManager *)pathTable_local,childBranch);
      if (N != (DdNode *)0x0) {
        entry = (char *)((ulong)topv & 0xfffffffffffffffe);
        iVar2 = st__lookup((st__table *)N,entry,(char **)&childPathLength);
        if ((iVar2 == 0) && (*(int *)((ulong)entry & 0xfffffffffffffffe) != 0x7fffffff)) {
          iVar2 = st__insert((st__table *)N,entry,(char *)0x0);
          if (iVar2 == -10000) {
            fprintf((FILE *)pathTable_local[0xc].bins,"Out of memory\n");
            return (DdNode *)0x0;
          }
          if (subsetNodeTable_local->max_density < *(int *)((long)&N->type + 4)) {
            *(undefined4 *)&subsetNodeTable_local->hash = 0;
          }
        }
      }
      if (topv == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        if (((ulong)info_local & 1) == 0) {
          nodeStatNnv->regResult = topv;
          uVar3 = (ulong)nodeStatNnv->regResult & 0xfffffffffffffffe;
          *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
          if (topv == (DdNode *)info_local) {
            if (nodeStatNnv->compResult != (DdNode *)0x0) {
              Cudd_RecursiveDeref((DdManager *)pathTable_local,nodeStatNnv->compResult);
            }
            nodeStatNnv->compResult = (DdNode *)((ulong)topv ^ 1);
            uVar3 = (ulong)nodeStatNnv->compResult & 0xfffffffffffffffe;
            *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
          }
        }
        else {
          nodeStatNnv->compResult = topv;
          uVar3 = (ulong)nodeStatNnv->compResult & 0xfffffffffffffffe;
          *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
          if (topv == (DdNode *)info_local) {
            if (nodeStatNnv->regResult != (DdNode *)0x0) {
              Cudd_RecursiveDeref((DdManager *)pathTable_local,nodeStatNnv->regResult);
            }
            nodeStatNnv->regResult = (DdNode *)((ulong)topv ^ 1);
            uVar3 = (ulong)nodeStatNnv->regResult & 0xfffffffffffffffe;
            *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
          }
        }
        *(int *)(((ulong)topv & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)topv & 0xfffffffffffffffe) + 4) + -1;
        dd_local = (DdManager *)topv;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
BuildSubsetBdd(
  DdManager * dd /* DD manager */,
  DdNode * node /* current node */,
  int * size /* current size of the subset */,
  st__table * visitedTable /* visited table storing all node data */,
  int  threshold,
  st__table * storeTable,
  st__table * approxTable)
{

    DdNode *Nv, *Nnv, *N, *topv, *neW;
    double minNv, minNnv;
    NodeData_t *currNodeQual;
    NodeData_t *currNodeQualT;
    NodeData_t *currNodeQualE;
    DdNode *ThenBranch, *ElseBranch;
    unsigned int topid;
    char *dummy;

#ifdef DEBUG
    num_calls++;
#endif
    /*If the size of the subset is below the threshold, dont do
      anything. */
    if ((*size) <= threshold) {
      /* store nodes below this, so we can recombine if possible */
      StoreNodes(storeTable, dd, node);
      return(node);
    }

    if (Cudd_IsConstant(node))
        return(node);

    /* Look up minterm count for this node. */
    if (! st__lookup(visitedTable, (const char *)node, (char **)&currNodeQual)) {
        fprintf(dd->err,
                "Something is wrong, ought to be in node quality table\n");
    }

    /* Get children. */
    N = Cudd_Regular(node);
    Nv = Cudd_T(N);
    Nnv = Cudd_E(N);

    /* complement if necessary */
    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    if (!Cudd_IsConstant(Nv)) {
        /* find out minterms and nodes contributed by then child */
        if (! st__lookup(visitedTable, (const char *)Nv, (char **)&currNodeQualT)) {
                fprintf(dd->out,"Something wrong, couldnt find nodes in node quality table\n");
                dd->errorCode = CUDD_INTERNAL_ERROR;
                return(NULL);
            }
        else {
            minNv = *(((NodeData_t *)currNodeQualT)->mintermPointer);
        }
    } else {
        if (Nv == zero) {
            minNv = 0;
        } else  {
            minNv = max;
        }
    }
    if (!Cudd_IsConstant(Nnv)) {
        /* find out minterms and nodes contributed by else child */
        if (! st__lookup(visitedTable, (const char *)Nnv, (char **)&currNodeQualE)) {
            fprintf(dd->out,"Something wrong, couldnt find nodes in node quality table\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        } else {
            minNnv = *(((NodeData_t *)currNodeQualE)->mintermPointer);
        }
    } else {
        if (Nnv == zero) {
            minNnv = 0;
        } else {
            minNnv = max;
        }
    }

    /* keep track of size of subset by subtracting the number of
     * differential nodes contributed by lighter child
     */
    *size = (*(size)) - (int)*(currNodeQual->lightChildNodesPointer);
    if (minNv >= minNnv) { /*SubsetCountNodesAux procedure takes
                             the Then branch in case of a tie */

        /* recur with the Then branch */
        ThenBranch = (DdNode *)BuildSubsetBdd(dd, Nv, size,
              visitedTable, threshold, storeTable, approxTable);
        if (ThenBranch == NULL) {
            return(NULL);
        }
        cuddRef(ThenBranch);
        /* The Else branch is either a node that already exists in the
         * subset, or one whose approximation has been computed, or
         * Zero.
         */
        if ( st__lookup(storeTable, (char *)Cudd_Regular(Nnv), &dummy)) {
          ElseBranch = Nnv;
          cuddRef(ElseBranch);
        } else {
          if ( st__lookup(approxTable, (char *)Nnv, &dummy)) {
            ElseBranch = (DdNode *)dummy;
            cuddRef(ElseBranch);
          } else {
            ElseBranch = zero;
            cuddRef(ElseBranch);
          }
        }

    }
    else {
        /* recur with the Else branch */
        ElseBranch = (DdNode *)BuildSubsetBdd(dd, Nnv, size,
                      visitedTable, threshold, storeTable, approxTable);
        if (ElseBranch == NULL) {
            return(NULL);
        }
        cuddRef(ElseBranch);
        /* The Then branch is either a node that already exists in the
         * subset, or one whose approximation has been computed, or
         * Zero.
         */
        if ( st__lookup(storeTable, (char *)Cudd_Regular(Nv), &dummy)) {
          ThenBranch = Nv;
          cuddRef(ThenBranch);
        } else {
          if ( st__lookup(approxTable, (char *)Nv, &dummy)) {
            ThenBranch = (DdNode *)dummy;
            cuddRef(ThenBranch);
          } else {
            ThenBranch = zero;
            cuddRef(ThenBranch);
          }
        }
    }

    /* construct the Bdd with the top variable and the two children */
    topid = Cudd_NodeReadIndex(N);
    topv = Cudd_ReadVars(dd, topid);
    cuddRef(topv);
    neW =  cuddBddIteRecur(dd, topv, ThenBranch, ElseBranch);
    if (neW != NULL) {
      cuddRef(neW);
    }
    Cudd_RecursiveDeref(dd, topv);
    Cudd_RecursiveDeref(dd, ThenBranch);
    Cudd_RecursiveDeref(dd, ElseBranch);


    if (neW == NULL)
        return(NULL);
    else {
        /* store this node in the store table */
        if (! st__lookup(storeTable, (char *)Cudd_Regular(neW), &dummy)) {
          cuddRef(neW);
          if (! st__insert(storeTable, (char *)Cudd_Regular(neW), NIL(char)))
              return (NULL);
        }
        /* store the approximation for this node */
        if (N !=  Cudd_Regular(neW)) {
            if ( st__lookup(approxTable, (char *)node, &dummy)) {
                fprintf(dd->err, "This node should not be in the approximated table\n");
            } else {
                cuddRef(neW);
                if (! st__insert(approxTable, (char *)node, (char *)neW))
                    return(NULL);
            }
        }
        cuddDeref(neW);
        return(neW);
    }
}